

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgzip.c
# Opt level: O1

FT_Error ft_gzip_check_header(FT_Stream stream)

{
  FT_Byte FVar1;
  char cVar2;
  FT_UInt16 FVar3;
  int iVar4;
  FT_Error error;
  FT_Byte head [4];
  FT_Error local_20;
  FT_Byte local_1c;
  char local_1b;
  char local_1a;
  byte local_19;
  
  local_20 = FT_Stream_Seek(stream,0);
  if ((local_20 == 0) && (local_20 = FT_Stream_Read(stream,&local_1c,4), local_20 == 0)) {
    if ((local_1c == '\x1f') && (((local_1b == -0x75 && (local_1a == '\b')) && (local_19 < 0x20))))
    {
      local_20 = FT_Stream_Skip(stream,6);
      if (((local_19 & 4) == 0) ||
         ((FVar3 = FT_Stream_ReadUShortLE(stream,&local_20), local_20 == 0 &&
          (local_20 = FT_Stream_Skip(stream,(ulong)FVar3), local_20 == 0)))) {
        if ((local_19 & 8) != 0) {
          do {
            FVar1 = FT_Stream_ReadByte(stream,&local_20);
            cVar2 = (FVar1 == '\0') * '\x03';
            if (local_20 != 0) {
              cVar2 = '\x02';
            }
          } while (cVar2 == '\0');
          if (cVar2 == '\x01') {
            return 1;
          }
          if (cVar2 == '\x02') {
            return local_20;
          }
        }
        if ((local_19 & 0x10) != 0) {
          do {
            FVar1 = FT_Stream_ReadByte(stream,&local_20);
            iVar4 = (uint)(FVar1 == '\0') * 5;
            if (local_20 != 0) {
              iVar4 = 2;
            }
          } while (iVar4 == 0);
          if (iVar4 == 2) {
            return local_20;
          }
          if (iVar4 != 5) {
            return iVar4;
          }
        }
        if ((local_19 & 2) != 0) {
          local_20 = FT_Stream_Skip(stream,2);
        }
      }
    }
    else {
      local_20 = 3;
    }
  }
  return local_20;
}

Assistant:

static FT_Error
  ft_gzip_check_header( FT_Stream  stream )
  {
    FT_Error  error;
    FT_Byte   head[4];


    if ( FT_STREAM_SEEK( 0 )       ||
         FT_STREAM_READ( head, 4 ) )
      goto Exit;

    /* head[0] && head[1] are the magic numbers;    */
    /* head[2] is the method, and head[3] the flags */
    if ( head[0] != 0x1F              ||
         head[1] != 0x8B              ||
         head[2] != Z_DEFLATED        ||
        (head[3] & FT_GZIP_RESERVED)  )
    {
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    /* skip time, xflags and os code */
    (void)FT_STREAM_SKIP( 6 );

    /* skip the extra field */
    if ( head[3] & FT_GZIP_EXTRA_FIELD )
    {
      FT_UInt  len;


      if ( FT_READ_USHORT_LE( len ) ||
           FT_STREAM_SKIP( len )    )
        goto Exit;
    }

    /* skip original file name */
    if ( head[3] & FT_GZIP_ORIG_NAME )
      for (;;)
      {
        FT_UInt  c;


        if ( FT_READ_BYTE( c ) )
          goto Exit;

        if ( c == 0 )
          break;
      }

    /* skip .gz comment */
    if ( head[3] & FT_GZIP_COMMENT )
      for (;;)
      {
        FT_UInt  c;


        if ( FT_READ_BYTE( c ) )
          goto Exit;

        if ( c == 0 )
          break;
      }

    /* skip CRC */
    if ( head[3] & FT_GZIP_HEAD_CRC )
      if ( FT_STREAM_SKIP( 2 ) )
        goto Exit;

  Exit:
    return error;
  }